

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignExpression.cpp
# Opt level: O0

BaseExpressionPtr __thiscall
Kandinsky::SignExpression::derivative(SignExpression *this,VariableExpressionPtr *param_2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Constant *in_RDI;
  BaseExpressionPtr BVar1;
  double in_stack_ffffffffffffff88;
  Constant *arg;
  
  arg = in_RDI;
  Constant::Constant(in_RDI,in_stack_ffffffffffffff88);
  BaseExpression::makePtr<Kandinsky::Constant>(arg);
  Constant::~Constant((Constant *)0x120aed);
  BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &in_RDI->super_BaseExpression;
  return (BaseExpressionPtr)
         BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr SignExpression::derivative(const VariableExpressionPtr& /*variable*/) const
    {
        return BaseExpression::makePtr(Constant(0));
    }